

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue promise_reaction_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSValueUnion *pJVar1;
  int *piVar2;
  JSRuntime *pJVar3;
  JSValue JVar4;
  int iVar5;
  ulong uVar6;
  int64_t iVar7;
  ulong uVar8;
  bool bVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue arg;
  JSValueUnion local_58;
  JSValueUnion local_48 [2];
  JSValueUnion local_38;
  int64_t iStack_30;
  
  iVar7 = argv[2].tag;
  JVar4 = argv[2];
  piVar2 = (int *)argv[3].u.ptr;
  JVar11 = argv[3];
  if (0xfffffff4 < (uint)argv[3].tag) {
    *piVar2 = *piVar2 + 1;
  }
  iVar5 = JS_ToBoolFree(ctx,JVar11);
  pJVar1 = &argv[4].u;
  local_58 = (JSValueUnion)pJVar1->ptr;
  iStack_30 = argv[4].tag;
  JVar10 = *(JSValue *)pJVar1;
  JVar11 = *(JSValue *)pJVar1;
  local_38 = local_58;
  if ((int)iVar7 == 3) {
    if (iVar5 == 0) {
      if (0xfffffff4 < (uint)iStack_30) {
        *(int *)local_58.ptr = *local_58.ptr + 1;
      }
    }
    else {
      if (0xfffffff4 < (uint)iStack_30) {
        *(int *)local_58.ptr = *local_58.ptr + 1;
      }
      JS_Throw(ctx,JVar11);
      JVar10 = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  else {
    local_58.ptr = (void *)((ulong)piVar2 & 0xffffffff00000000);
    JVar11.tag = 3;
    JVar11.u.ptr = local_58.ptr;
    JVar10 = JS_CallInternal(ctx,JVar4,(JSValue)(ZEXT816(3) << 0x40),JVar11,1,(JSValue *)&local_38,2
                            );
  }
  local_48 = (JSValueUnion  [2])JVar10;
  if ((JVar10.tag & 0xffffffffU) == 6) {
    pJVar3 = ctx->rt;
    local_48 = (pJVar3->current_exception).u;
    (pJVar3->current_exception).u.int32 = 0;
    (pJVar3->current_exception).tag = 2;
  }
  bVar9 = (int)JVar10.tag == 6;
  if ((int)argv[bVar9].tag == 3) {
    iVar7 = 3;
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    local_58.float64 = local_58.float64 & 0xffffffff00000000;
    JVar4.tag = 3;
    JVar4.u.ptr = local_58.ptr;
    JVar10.tag = argv[bVar9].tag;
    JVar10.u.ptr = argv[bVar9].u.ptr;
    JVar11 = JS_CallInternal(ctx,JVar10,(JSValue)(ZEXT816(3) << 0x40),JVar4,1,(JSValue *)local_48,2)
    ;
    iVar7 = JVar11.tag;
    uVar8 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
    uVar6 = (ulong)JVar11.u._0_4_;
  }
  if ((0xfffffff4 < local_48[1]._0_4_) &&
     (iVar5 = *local_48[0].ptr, *(int *)local_48[0].ptr = iVar5 + -1, iVar5 < 2)) {
    __JS_FreeValueRT(ctx->rt,(JSValue)local_48);
  }
  JVar12.tag = iVar7;
  JVar12.u.ptr = (void *)(uVar8 | uVar6);
  return JVar12;
}

Assistant:

static JSValue promise_reaction_job(JSContext *ctx, int argc,
                                    JSValueConst *argv)
{
    JSValueConst handler, arg, func;
    JSValue res, res2;
    BOOL is_reject;

    assert(argc == 5);
    handler = argv[2];
    is_reject = JS_ToBool(ctx, argv[3]);
    arg = argv[4];
#ifdef DUMP_PROMISE
    printf("promise_reaction_job: is_reject=%d\n", is_reject);
#endif

    if (JS_IsUndefined(handler)) {
        if (is_reject) {
            res = JS_Throw(ctx, JS_DupValue(ctx, arg));
        } else {
            res = JS_DupValue(ctx, arg);
        }
    } else {
        res = JS_Call(ctx, handler, JS_UNDEFINED, 1, &arg);
    }
    is_reject = JS_IsException(res);
    if (is_reject)
        res = JS_GetException(ctx);
    func = argv[is_reject];
    /* as an extension, we support undefined as value to avoid
       creating a dummy promise in the 'await' implementation of async
       functions */
    if (!JS_IsUndefined(func)) {
        res2 = JS_Call(ctx, func, JS_UNDEFINED,
                       1, (JSValueConst *)&res);
    } else {
        res2 = JS_UNDEFINED;
    }
    JS_FreeValue(ctx, res);

    return res2;
}